

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O1

void * absl::base_internal::DoAllocWithArena(size_t request,Arena *arena)

{
  AllocList *head;
  long *plVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  AllocList *e;
  uint *puVar6;
  AllocList *pAVar7;
  ulong uVar8;
  ulong uVar9;
  ArenaLock section;
  AllocList *prev [30];
  ArenaLock local_1b8;
  AllocList *local_128 [31];
  
  if (request == 0) {
    return (void *)0x0;
  }
  anon_unknown_0::ArenaLock::ArenaLock(&local_1b8,arena);
  if (request < 0xffffffffffffffe0) {
    uVar9 = request + arena->round_up + 0x1f;
    if (uVar9 < request + 0x20) goto LAB_001988aa;
    uVar9 = uVar9 & -arena->round_up;
    head = &arena->freelist;
    do {
      iVar4 = LLA_SkiplistLevels(uVar9,arena->min_size,(uint32_t *)0x0);
      if ((arena->freelist).levels < iVar4) {
LAB_001985c4:
        LOCK();
        uVar5 = (arena->mu).lockword_.super___atomic_base<unsigned_int>._M_i;
        (arena->mu).lockword_.super___atomic_base<unsigned_int>._M_i =
             (arena->mu).lockword_.super___atomic_base<unsigned_int>._M_i & 2;
        UNLOCK();
        if (7 < uVar5) {
          SpinLock::SlowUnlock(&arena->mu,uVar5);
        }
        uVar8 = arena->pagesize * 0x10 + (uVar9 - 1);
        if (uVar8 < uVar9) {
LAB_00198846:
          raw_log_internal::RawLog
                    (kFatal,"low_level_alloc.cc",0x1b5,"Check %s failed: %s","sum >= a",
                     "LowLevelAlloc arithmetic overflow");
          DoAllocWithArena();
          goto LAB_00198878;
        }
        uVar8 = uVar8 & arena->pagesize * -0x10;
        if ((arena->flags & 2) == 0) {
          e = (AllocList *)mmap((void *)0x0,uVar8,3,0x22,-1,0);
        }
        else {
          e = (AllocList *)syscall(9,0,uVar8,3,0x22,0xffffffffffffffff,0);
        }
        if (e == (AllocList *)0xffffffffffffffff) goto LAB_00198940;
        uVar5 = (arena->mu).lockword_.super___atomic_base<unsigned_int>._M_i;
        if ((uVar5 & 1) == 0) {
          LOCK();
          uVar2 = (arena->mu).lockword_.super___atomic_base<unsigned_int>._M_i;
          if (uVar5 == uVar2) {
            (arena->mu).lockword_.super___atomic_base<unsigned_int>._M_i = uVar5 | 1;
            uVar2 = uVar5;
          }
          uVar5 = uVar2;
          UNLOCK();
        }
        if ((uVar5 & 1) != 0) {
          SpinLock::SlowLock(&arena->mu);
        }
        (e->header).size = uVar8;
        (e->header).magic = (ulong)e ^ 0x4c833e95;
        (e->header).arena = arena;
        bVar3 = false;
        AddToFreelist(&e->levels,arena);
      }
      else {
        pAVar7 = head;
LAB_00198555:
        if (pAVar7->levels < iVar4) {
          raw_log_internal::RawLog
                    (kFatal,"low_level_alloc.cc",0x1c5,"Check %s failed: %s","i < prev->levels",
                     "too few levels in Next()");
          DoAllocWithArena();
LAB_0019877e:
          raw_log_internal::RawLog
                    (kFatal,"low_level_alloc.cc",0x1ca,"Check %s failed: %s",
                     "next->header.magic == Magic(kMagicUnallocated, &next->header)",
                     "bad magic number in Next()");
          DoAllocWithArena();
LAB_001987b0:
          raw_log_internal::RawLog
                    (kFatal,"low_level_alloc.cc",0x1cb,"Check %s failed: %s",
                     "next->header.arena == arena","bad arena pointer in Next()");
          DoAllocWithArena();
LAB_001987e2:
          raw_log_internal::RawLog
                    (kFatal,"low_level_alloc.cc",0x1cd,"Check %s failed: %s","prev < next",
                     "unordered freelist");
          DoAllocWithArena();
LAB_00198814:
          raw_log_internal::RawLog
                    (kFatal,"low_level_alloc.cc",0x1d0,"Check %s failed: %s",
                     "reinterpret_cast<char *>(prev) + prev->header.size < reinterpret_cast<char *>(next)"
                     ,"malformed freelist");
          DoAllocWithArena();
          goto LAB_00198846;
        }
        e = pAVar7->next[iVar4 + -1];
        if (e != (AllocList *)0x0) {
          if (((e->header).magic ^ (ulong)e) != 0xffffffffb37cc16a) goto LAB_0019877e;
          if ((e->header).arena != arena) goto LAB_001987b0;
          if (head != pAVar7) {
            if (e <= pAVar7) goto LAB_001987e2;
            if ((AllocList *)((long)pAVar7->next + ((pAVar7->header).size - 0x28)) < e)
            goto LAB_001985a2;
            goto LAB_00198814;
          }
LAB_001985a2:
          bVar3 = true;
          if ((e == (AllocList *)0x0) || (pAVar7 = e, uVar9 <= (e->header).size)) goto LAB_001985bb;
          goto LAB_00198555;
        }
        bVar3 = false;
LAB_001985bb:
        if (e == (AllocList *)0x0) goto LAB_001985c4;
      }
    } while (!bVar3);
    LLA_SkiplistDelete(head,e,local_128);
    if (!CARRY8(arena->min_size,uVar9)) {
      uVar8 = (e->header).size;
      if (arena->min_size + uVar9 <= uVar8) {
        plVar1 = (long *)((long)e->next + (uVar9 - 0x28));
        *plVar1 = uVar8 - uVar9;
        plVar1[1] = (long)e->next + (uVar9 - 0x28) ^ 0x4c833e95;
        plVar1[2] = (long)arena;
        (e->header).size = uVar9;
        AddToFreelist(plVar1 + 4,arena);
      }
      (e->header).magic = (ulong)e ^ 0x4c833e95;
      if ((e->header).arena == arena) {
        arena->allocation_count = arena->allocation_count + 1;
        anon_unknown_0::ArenaLock::Leave(&local_1b8);
        anon_unknown_0::ArenaLock::~ArenaLock(&local_1b8);
        return &e->levels;
      }
      goto LAB_0019890e;
    }
  }
  else {
LAB_00198878:
    raw_log_internal::RawLog
              (kFatal,"low_level_alloc.cc",0x1b5,"Check %s failed: %s","sum >= a",
               "LowLevelAlloc arithmetic overflow");
    DoAllocWithArena();
LAB_001988aa:
    raw_log_internal::RawLog
              (kFatal,"low_level_alloc.cc",0x1b5,"Check %s failed: %s","sum >= a",
               "LowLevelAlloc arithmetic overflow");
    DoAllocWithArena();
  }
  raw_log_internal::RawLog
            (kFatal,"low_level_alloc.cc",0x1b5,"Check %s failed: %s","sum >= a",
             "LowLevelAlloc arithmetic overflow");
  DoAllocWithArena();
LAB_0019890e:
  raw_log_internal::RawLog
            (kFatal,"low_level_alloc.cc",0x260,"Check %s failed: %s","s->header.arena == arena","");
  DoAllocWithArena();
LAB_00198940:
  puVar6 = (uint *)__errno_location();
  raw_log_internal::RawLog(kFatal,"low_level_alloc.cc",0x23a,"mmap error: %d",(ulong)*puVar6);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/base/internal/low_level_alloc.cc"
                ,0x23a,"void *absl::base_internal::DoAllocWithArena(size_t, LowLevelAlloc::Arena *)"
               );
}

Assistant:

static void *DoAllocWithArena(size_t request, LowLevelAlloc::Arena *arena) {
  void *result = nullptr;
  if (request != 0) {
    AllocList *s;  // will point to region that satisfies request
    ArenaLock section(arena);
    // round up with header
    size_t req_rnd =
        RoundUp(CheckedAdd(request, sizeof(s->header)), arena->round_up);
    for (;;) {  // loop until we find a suitable region
      // find the minimum levels that a block of this size must have
      int i = LLA_SkiplistLevels(req_rnd, arena->min_size, nullptr) - 1;
      if (i < arena->freelist.levels) {        // potential blocks exist
        AllocList *before = &arena->freelist;  // predecessor of s
        while ((s = Next(i, before, arena)) != nullptr &&
               s->header.size < req_rnd) {
          before = s;
        }
        if (s != nullptr) {  // we found a region
          break;
        }
      }
      // we unlock before mmap() both because mmap() may call a callback hook,
      // and because it may be slow.
      arena->mu.Unlock();
      // mmap generous 64K chunks to decrease
      // the chances/impact of fragmentation:
      size_t new_pages_size = RoundUp(req_rnd, arena->pagesize * 16);
      void *new_pages;
#ifdef _WIN32
      new_pages = VirtualAlloc(nullptr, new_pages_size,
                               MEM_RESERVE | MEM_COMMIT, PAGE_READWRITE);
      ABSL_RAW_CHECK(new_pages != nullptr, "VirtualAlloc failed");
#else
#ifndef ABSL_LOW_LEVEL_ALLOC_ASYNC_SIGNAL_SAFE_MISSING
      if ((arena->flags & LowLevelAlloc::kAsyncSignalSafe) != 0) {
        new_pages = base_internal::DirectMmap(nullptr, new_pages_size,
            PROT_WRITE|PROT_READ, MAP_ANONYMOUS|MAP_PRIVATE, -1, 0);
      } else {
        new_pages = mmap(nullptr, new_pages_size, PROT_WRITE | PROT_READ,
                         MAP_ANONYMOUS | MAP_PRIVATE, -1, 0);
      }
#else
      new_pages = mmap(nullptr, new_pages_size, PROT_WRITE | PROT_READ,
                       MAP_ANONYMOUS | MAP_PRIVATE, -1, 0);
#endif  // ABSL_LOW_LEVEL_ALLOC_ASYNC_SIGNAL_SAFE_MISSING
      if (new_pages == MAP_FAILED) {
        ABSL_RAW_LOG(FATAL, "mmap error: %d", errno);
      }

#ifdef __linux__
#if defined(PR_SET_VMA) && defined(PR_SET_VMA_ANON_NAME)
      // Attempt to name the allocated address range in /proc/$PID/smaps on
      // Linux.
      //
      // This invocation of prctl() may fail if the Linux kernel was not
      // configured with the CONFIG_ANON_VMA_NAME option.  This is OK since
      // the naming of arenas is primarily a debugging aid.
      prctl(PR_SET_VMA, PR_SET_VMA_ANON_NAME, new_pages, new_pages_size,
            "absl");
#endif
#endif  // __linux__
#endif  // _WIN32
      arena->mu.Lock();
      s = reinterpret_cast<AllocList *>(new_pages);
      s->header.size = new_pages_size;
      // Pretend the block is allocated; call AddToFreelist() to free it.
      s->header.magic = Magic(kMagicAllocated, &s->header);
      s->header.arena = arena;
      AddToFreelist(&s->levels, arena);  // insert new region into free list
    }
    AllocList *prev[kMaxLevel];
    LLA_SkiplistDelete(&arena->freelist, s, prev);  // remove from free list
    // s points to the first free region that's big enough
    if (CheckedAdd(req_rnd, arena->min_size) <= s->header.size) {
      // big enough to split
      AllocList *n =
          reinterpret_cast<AllocList *>(req_rnd + reinterpret_cast<char *>(s));
      n->header.size = s->header.size - req_rnd;
      n->header.magic = Magic(kMagicAllocated, &n->header);
      n->header.arena = arena;
      s->header.size = req_rnd;
      AddToFreelist(&n->levels, arena);
    }
    s->header.magic = Magic(kMagicAllocated, &s->header);
    ABSL_RAW_CHECK(s->header.arena == arena, "");
    arena->allocation_count++;
    section.Leave();
    result = &s->levels;
  }
  ABSL_ANNOTATE_MEMORY_IS_UNINITIALIZED(result, request);
  return result;
}